

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_manager_stateless_kernel_1.h
# Opt level: O0

tab_data * __thiscall
dlib::memory_manager_stateless_kernel_1<dlib::tabbed_display::tab_data>::allocate_array
          (memory_manager_stateless_kernel_1<dlib::tabbed_display::tab_data> *this,
          unsigned_long size)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  ulong *puVar3;
  tab_data *ptVar4;
  ulong in_RSI;
  ulong uVar5;
  tab_data *local_40;
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = in_RSI;
  uVar2 = SUB168(auVar1 * ZEXT816(0x50),0);
  uVar5 = uVar2 + 8;
  if (SUB168(auVar1 * ZEXT816(0x50),8) != 0 || 0xfffffffffffffff7 < uVar2) {
    uVar5 = 0xffffffffffffffff;
  }
  puVar3 = (ulong *)operator_new__(uVar5);
  *puVar3 = in_RSI;
  ptVar4 = (tab_data *)(puVar3 + 1);
  if (in_RSI != 0) {
    local_40 = ptVar4;
    do {
      tabbed_display::tab_data::tab_data(local_40);
      local_40 = local_40 + 1;
    } while (local_40 != ptVar4 + in_RSI);
  }
  return ptVar4;
}

Assistant:

T* allocate_array (
                unsigned long size
            ) 
            { 
                return new T[size];
            }